

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrecord.cpp
# Opt level: O3

void __thiscall QSqlRecord::append(QSqlRecord *this,QSqlField *field)

{
  QSqlRecordPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QSqlRecordPrivate *)0x0) {
    pQVar1 = (QSqlRecordPrivate *)0x0;
  }
  else if ((__atomic_base<int>)
           *(__int_type *)
            &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1) {
    QExplicitlySharedDataPointer<QSqlRecordPrivate>::detach_helper(&this->d);
    pQVar1 = (this->d).d.ptr;
  }
  QtPrivate::QMovableArrayOps<QSqlField>::emplace<QSqlField_const&>
            ((QMovableArrayOps<QSqlField> *)&pQVar1->fields,(pQVar1->fields).d.size,field);
  QList<QSqlField>::end(&pQVar1->fields);
  return;
}

Assistant:

void QSqlRecord::append(const QSqlField &field)
{
    detach();
    d->fields.append(field);
}